

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::cureLocalIntersections(Earcut<unsigned_int> *this,Node *start)

{
  Node *pNVar1;
  Node *q2;
  iterator iVar2;
  Node *pNVar3;
  bool bVar4;
  Node *pNVar5;
  
  pNVar5 = start;
  do {
    pNVar1 = pNVar5->prev;
    q2 = pNVar5->next->next;
    if ((pNVar1->x != q2->x) || (NAN(pNVar1->x) || NAN(q2->x))) {
LAB_0014aeaa:
      bVar4 = intersects(this,pNVar1,pNVar5,pNVar5->next,q2);
      if (((bVar4) && (bVar4 = locallyInside(this,pNVar1,q2), bVar4)) &&
         (bVar4 = locallyInside(this,q2,pNVar1), bVar4)) {
        iVar2._M_current =
             (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&pNVar1->i);
        }
        else {
          *iVar2._M_current = pNVar1->i;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&pNVar5->i);
        }
        else {
          *iVar2._M_current = pNVar5->i;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&q2->i);
        }
        else {
          *iVar2._M_current = q2->i;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        pNVar1 = pNVar5->next;
        pNVar1->prev = pNVar5->prev;
        pNVar5->prev->next = pNVar1;
        pNVar1 = pNVar5->prevZ;
        if (pNVar1 != (Node *)0x0) {
          pNVar1->nextZ = pNVar5->nextZ;
        }
        if (pNVar5->nextZ != (Node *)0x0) {
          pNVar5->nextZ->prevZ = pNVar1;
        }
        pNVar1 = pNVar5->next;
        pNVar5 = pNVar1->next;
        pNVar5->prev = pNVar1->prev;
        pNVar1->prev->next = pNVar5;
        pNVar3 = pNVar1->prevZ;
        if (pNVar3 != (Node *)0x0) {
          pNVar3->nextZ = pNVar1->nextZ;
        }
        start = q2;
        pNVar5 = q2;
        if (pNVar1->nextZ != (Node *)0x0) {
          pNVar1->nextZ->prevZ = pNVar3;
        }
      }
    }
    else if ((pNVar1->y != q2->y) || (NAN(pNVar1->y) || NAN(q2->y))) goto LAB_0014aeaa;
    pNVar5 = pNVar5->next;
    if (pNVar5 == start) {
      pNVar5 = filterPoints(this,pNVar5,(Node *)0x0);
      return pNVar5;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::cureLocalIntersections(Node* start) {
    Node* p = start;
    do {
        Node* a = p->prev;
        Node* b = p->next->next;

        // a self-intersection where edge (v[i-1],v[i]) intersects (v[i+1],v[i+2])
        if (!equals(a, b) && intersects(a, p, p->next, b) && locallyInside(a, b) && locallyInside(b, a)) {
            indices.emplace_back(a->i);
            indices.emplace_back(p->i);
            indices.emplace_back(b->i);

            // remove two nodes involved
            removeNode(p);
            removeNode(p->next);

            p = start = b;
        }
        p = p->next;
    } while (p != start);

    return filterPoints(p);
}